

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.cpp
# Opt level: O1

void __thiscall Al::internal::ProgressEngine::~ProgressEngine(ProgressEngine *this)

{
  void *pvVar1;
  long lVar2;
  
  std::
  _Hashtable<void_*,_std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>,_std::allocator<std::pair<void_*const,_std::array<std::vector<Al::internal::AlState_*,_std::allocator<Al::internal::AlState_*>_>,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->run_queues)._M_h);
  lVar2 = 0x7e88;
  do {
    pvVar1 = *(void **)((long)this->request_queues + lVar2 + -0x80);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
    lVar2 = lVar2 + -0x200;
  } while (lVar2 != -0x178);
  std::condition_variable::~condition_variable(&this->startup_cv);
  if ((this->thread)._M_id._M_thread == 0) {
    return;
  }
  std::terminate();
}

Assistant:

ProgressEngine::~ProgressEngine() {}